

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

int16_t mpack_expect_i16(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_tag_t mVar2;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if (mVar2.type == mpack_type_uint) {
    if (aVar1.u < 0x8000) {
      return mVar2.v._0_2_;
    }
  }
  else if (((mVar2.type == mpack_type_int) && (-0x8001 < aVar1.i)) && (aVar1.i < 0x8000)) {
    return mVar2.v._0_2_;
  }
  mpack_reader_flag_error(reader,mpack_error_type);
  return 0;
}

Assistant:

int16_t mpack_expect_i16(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        if (var.v.u <= INT16_MAX)
            return (int16_t)var.v.u;
    } else if (var.type == mpack_type_int) {
        if (var.v.i >= INT16_MIN && var.v.i <= INT16_MAX)
            return (int16_t)var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}